

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall olc::PixelGameEngine::pgex_Register(PixelGameEngine *this,PGEX *pgex)

{
  __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_> _Var1;
  PGEX *local_10;
  
  local_10 = pgex;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<olc::PGEX**,std::vector<olc::PGEX*,std::allocator<olc::PGEX*>>>,__gnu_cxx::__ops::_Iter_equals_val<olc::PGEX*const>>
                    ((this->vExtensions).
                     super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->vExtensions).
                     super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::push_back(&this->vExtensions,&local_10);
  }
  return;
}

Assistant:

void PixelGameEngine::pgex_Register(olc::PGEX *pgex)
	{
		if (std::find(vExtensions.begin(), vExtensions.end(), pgex) == vExtensions.end())
			vExtensions.push_back(pgex);
	}